

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZParFrontStructMatrix.cpp
# Opt level: O0

void * TPZParFrontStructMatrix<TPZFrontNonSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>
       ::GlobalAssemble(void *t)

{
  int64_t index;
  TPZCompEl *pTVar1;
  bool bVar2;
  ostream *poVar3;
  int *piVar4;
  TPZCompEl **ppTVar5;
  long *plVar6;
  int64_t iVar7;
  TPZElementMatrix **ppTVar8;
  long lVar9;
  TPZElementMatrix *pTVar10;
  TPZElementMatrix *pTVar11;
  TPZGuiInterface *this;
  TPZParFrontMatrix<std::complex<double>,_TPZFileEqnStorage<std::complex<double>_>,_TPZFrontNonSym<std::complex<double>_>_>
  *this_00;
  long in_RDI;
  TPZParFrontMatrix<std::complex<double>,_TPZFileEqnStorage<std::complex<double>_>,_TPZFrontNonSym<std::complex<double>_>_>
  *mat_2;
  TPZParFrontMatrix<std::complex<double>,_TPZFileEqnStorage<std::complex<double>_>,_TPZFrontNonSym<std::complex<double>_>_>
  *mat_1;
  int64_t itemp;
  TPZElementMatrix *eftemp;
  TPZElementMatrix *ektemp;
  unique_lock<std::mutex> global_lock;
  TPZElementMatrix *efaux;
  TPZElementMatrix *ekaux;
  int64_t aux;
  int64_t i;
  TPZCondensedCompEl *condel;
  TPZElementGroup *elgrp;
  TPZSubCompMesh *submesh;
  int matid;
  TPZMaterial *mat;
  TPZCompEl *el;
  int64_t local_element;
  int unit;
  TPZAdmChunkVector<TPZCompEl_*,_10> *elementvec;
  TPZParFrontStructMatrix<TPZFrontNonSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>
  *parfront;
  mutex_type *in_stack_fffffffffffffe38;
  TPZParFrontMatrix<std::complex<double>,_TPZFileEqnStorage<std::complex<double>_>,_TPZFrontNonSym<std::complex<double>_>_>
  *in_stack_fffffffffffffe40;
  TPZStack<TPZElementMatrix_*,_10> *in_stack_fffffffffffffe48;
  TPZElementMatrix *in_stack_fffffffffffffe58;
  TPZStructMatrix *in_stack_fffffffffffffe60;
  TPZElementMatrix *in_stack_fffffffffffffe68;
  TPZElementMatrix *in_stack_fffffffffffffe70;
  TPZCompEl *in_stack_fffffffffffffe78;
  TPZElementMatrix *in_stack_fffffffffffffe80;
  long local_100;
  long local_f0;
  long local_e0;
  int local_c8;
  TPZElementMatrix *local_78;
  TPZElementMatrix *local_70;
  long local_68;
  int64_t local_60;
  
  TPZCompMesh::ElementVec(*(TPZCompMesh **)(in_RDI + 8));
LAB_01de95b8:
  do {
    do {
      if (*(long *)(in_RDI + 0x160) <= *(long *)(in_RDI + 0x158)) goto LAB_01de9fd5;
      if (*(long *)(in_RDI + 0x160) / 200 == 0) {
        local_c8 = 1;
      }
      else {
        local_c8 = (int)(*(long *)(in_RDI + 0x160) / 200);
      }
      if (*(long *)(in_RDI + 0x158) % (long)local_c8 == 0) {
        std::operator<<((ostream *)&std::cout,"*");
      }
      std::ostream::flush();
      if ((*(long *)(in_RDI + 0x158) % (long)(local_c8 * 0x14) == 0) &&
         (*(long *)(in_RDI + 0x158) != 0)) {
        if (*(long *)(in_RDI + 0x150) == *(long *)(in_RDI + 0x160)) {
          poVar3 = std::operator<<((ostream *)&std::cout," ");
          poVar3 = (ostream *)
                   std::ostream::operator<<
                             (poVar3,(*(long *)(in_RDI + 0x158) * 100) / *(long *)(in_RDI + 0x160));
          poVar3 = std::operator<<(poVar3,"% Elements assembled ");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          std::ostream::flush();
        }
        else {
          poVar3 = std::operator<<((ostream *)&std::cout," Element ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(long *)(in_RDI + 0x150));
          poVar3 = std::operator<<(poVar3," ");
          poVar3 = (ostream *)
                   std::ostream::operator<<
                             (poVar3,(*(long *)(in_RDI + 0x150) * 100) / *(long *)(in_RDI + 0x160));
          poVar3 = std::operator<<(poVar3,"% Elements computed ");
          poVar3 = (ostream *)
                   std::ostream::operator<<
                             (poVar3,(*(long *)(in_RDI + 0x158) * 100) / *(long *)(in_RDI + 0x160));
          poVar3 = std::operator<<(poVar3,"% Elements assembled ");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          std::ostream::flush();
        }
      }
      index = *(int64_t *)(in_RDI + 0x158);
      *(long *)(in_RDI + 0x158) = *(long *)(in_RDI + 0x158) + 1;
      piVar4 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 0x120),index);
    } while (*piVar4 < 0);
    TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 0x120),index);
    ppTVar5 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                        ((TPZChunkVector<TPZCompEl_*,_10> *)in_stack_fffffffffffffe60,
                         (int64_t)in_stack_fffffffffffffe58);
    pTVar1 = *ppTVar5;
  } while (pTVar1 == (TPZCompEl *)0x0);
  plVar6 = (long *)(**(code **)(*(long *)pTVar1 + 0xb8))();
  if (plVar6 == (long *)0x0) {
    if (pTVar1 == (TPZCompEl *)0x0) {
      local_e0 = 0;
      local_f0 = 0;
      local_100 = 0;
    }
    else {
      local_e0 = __dynamic_cast(pTVar1,&TPZCompEl::typeinfo,&TPZSubCompMesh::typeinfo,0x918);
      local_f0 = __dynamic_cast(pTVar1,&TPZCompEl::typeinfo,&TPZElementGroup::typeinfo,0);
      local_100 = __dynamic_cast(pTVar1,&TPZCompEl::typeinfo,&TPZCondensedCompEl::typeinfo,0);
    }
    if (((local_e0 == 0) && (local_f0 == 0)) && (local_100 == 0)) goto LAB_01de95b8;
  }
  else {
    (**(code **)(*plVar6 + 0x58))();
    bVar2 = ::TPZStructMatrix::ShouldCompute
                      (in_stack_fffffffffffffe60,(int)((ulong)in_stack_fffffffffffffe58 >> 0x20));
    if (!bVar2) goto LAB_01de95b8;
  }
  local_60 = 0;
  local_68 = -1;
  local_70 = (TPZElementMatrix *)0x0;
  local_78 = (TPZElementMatrix *)0x0;
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  while (local_68 != index) {
    for (; iVar7 = TPZVec<long>::NElements((TPZVec<long> *)(in_RDI + 0x180)), local_60 < iVar7;
        local_60 = local_60 + 1) {
      plVar6 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x180),local_60);
      if (*plVar6 == index) {
        plVar6 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x180),local_60);
        local_68 = *plVar6;
        ppTVar8 = TPZVec<TPZElementMatrix_*>::operator[]
                            ((TPZVec<TPZElementMatrix_*> *)(in_RDI + 0x1f0),local_60);
        local_70 = *ppTVar8;
        ppTVar8 = TPZVec<TPZElementMatrix_*>::operator[]
                            ((TPZVec<TPZElementMatrix_*> *)(in_RDI + 0x260),local_60);
        local_78 = *ppTVar8;
        lVar9 = TPZStack<long,_10>::Pop((TPZStack<long,_10> *)in_stack_fffffffffffffe48);
        pTVar10 = TPZStack<TPZElementMatrix_*,_10>::Pop(in_stack_fffffffffffffe48);
        pTVar11 = TPZStack<TPZElementMatrix_*,_10>::Pop(in_stack_fffffffffffffe48);
        iVar7 = TPZVec<long>::NElements((TPZVec<long> *)(in_RDI + 0x180));
        if (iVar7 < *(int *)(in_RDI + 0x168)) {
          std::condition_variable::notify_all();
        }
        iVar7 = TPZVec<long>::NElements((TPZVec<long> *)(in_RDI + 0x180));
        if (local_60 < iVar7) {
          plVar6 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x180),local_60);
          *plVar6 = lVar9;
          ppTVar8 = TPZVec<TPZElementMatrix_*>::operator[]
                              ((TPZVec<TPZElementMatrix_*> *)(in_RDI + 0x1f0),local_60);
          *ppTVar8 = pTVar10;
          in_stack_fffffffffffffe78 =
               (TPZCompEl *)
               TPZVec<TPZElementMatrix_*>::operator[]
                         ((TPZVec<TPZElementMatrix_*> *)(in_RDI + 0x260),local_60);
          *(TPZElementMatrix **)in_stack_fffffffffffffe78 = pTVar11;
          in_stack_fffffffffffffe70 = pTVar11;
          in_stack_fffffffffffffe80 = pTVar10;
        }
        break;
      }
    }
    if (local_68 != index) {
      local_60 = 0;
      std::condition_variable::wait((unique_lock *)condassemble);
    }
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)in_stack_fffffffffffffe40);
  TPZFrontStructMatrix<TPZFrontNonSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>
  ::AssembleElement((TPZFrontStructMatrix<TPZFrontNonSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>
                     *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70
                    ,in_stack_fffffffffffffe68,
                    (TPZMatrix<std::complex<double>_> *)in_stack_fffffffffffffe60,
                    (TPZFMatrix<std::complex<double>_> *)in_stack_fffffffffffffe58);
  if (*(long *)(in_RDI + 0x158) == *(long *)(in_RDI + 0x160)) {
    in_stack_fffffffffffffe68 = *(TPZElementMatrix **)(in_RDI + 0x170);
    if (in_stack_fffffffffffffe68 == (TPZElementMatrix *)0x0) {
      in_stack_fffffffffffffe60 = (TPZStructMatrix *)0x0;
    }
    else {
      in_stack_fffffffffffffe60 =
           (TPZStructMatrix *)
           __dynamic_cast(in_stack_fffffffffffffe68,&TPZMatrix<std::complex<double>>::typeinfo,
                          &TPZParFrontMatrix<std::complex<double>,TPZFileEqnStorage<std::complex<double>>,TPZFrontNonSym<std::complex<double>>>
                           ::typeinfo,0);
    }
    TPZParFrontMatrix<std::complex<double>,_TPZFileEqnStorage<std::complex<double>_>,_TPZFrontNonSym<std::complex<double>_>_>
    ::FinishWriting(in_stack_fffffffffffffe40);
  }
  in_stack_fffffffffffffe58 = local_70;
  if (local_70 != (TPZElementMatrix *)0x0) {
    (*local_70->_vptr_TPZElementMatrix[1])();
    in_stack_fffffffffffffe58 = local_70;
  }
  if (local_78 != (TPZElementMatrix *)0x0) {
    (*local_78->_vptr_TPZElementMatrix[1])();
  }
  bVar2 = ::TPZAutoPointer::operator_cast_to_bool((TPZAutoPointer *)(in_RDI + 0x148));
  if (bVar2) {
    this = TPZAutoPointer<TPZGuiInterface>::operator->
                     ((TPZAutoPointer<TPZGuiInterface> *)(in_RDI + 0x148));
    bVar2 = TPZGuiInterface::AmIKilled(this);
    if (bVar2) {
      if (*(long *)(in_RDI + 0x170) == 0) {
        this_00 = (TPZParFrontMatrix<std::complex<double>,_TPZFileEqnStorage<std::complex<double>_>,_TPZFrontNonSym<std::complex<double>_>_>
                   *)0x0;
      }
      else {
        this_00 = (TPZParFrontMatrix<std::complex<double>,_TPZFileEqnStorage<std::complex<double>_>,_TPZFrontNonSym<std::complex<double>_>_>
                   *)__dynamic_cast(*(long *)(in_RDI + 0x170),
                                    &TPZMatrix<std::complex<double>>::typeinfo,
                                    &TPZParFrontMatrix<std::complex<double>,TPZFileEqnStorage<std::complex<double>>,TPZFrontNonSym<std::complex<double>>>
                                     ::typeinfo,0);
      }
      TPZParFrontMatrix<std::complex<double>,_TPZFileEqnStorage<std::complex<double>_>,_TPZFrontNonSym<std::complex<double>_>_>
      ::FinishWriting(this_00);
LAB_01de9fd5:
      std::operator<<((ostream *)&std::cout,"Matrix assembled\n");
      std::ostream::flush();
      return (void *)0x0;
    }
  }
  goto LAB_01de95b8;
}

Assistant:

void *TPZParFrontStructMatrix<TFront,TVar,TPar>::GlobalAssemble(void *t){
    
	TPZParFrontStructMatrix<TFront,TVar,TPar> *parfront = (TPZParFrontStructMatrix<TFront,TVar,TPar> *) t;
	TPZAdmChunkVector<TPZCompEl *> &elementvec = parfront->fMesh->ElementVec();
	while(parfront->fCurrentAssembled < parfront->fNElements) {
		
#ifndef USING_ATLAS
        const int unit = (parfront->fNElements/200 == 0 ? 1 : parfront->fNElements/200);
        if(!(parfront->fCurrentAssembled%unit))std::cout << "*";
		std::cout.flush();
		if(!(parfront->fCurrentAssembled%(20*unit)) && parfront->fCurrentAssembled)
        {
			if(parfront->fCurrentElement!=parfront->fNElements){
				std::cout << " Element " << parfront->fCurrentElement << " " << (100*parfront->fCurrentElement/parfront->fNElements) << "% Elements computed " << (100*parfront->fCurrentAssembled/parfront->fNElements) << "% Elements assembled " << std::endl;
				std::cout.flush();
			}else{
				std::cout << " " << (100*parfront->fCurrentAssembled/parfront->fNElements) << "% Elements assembled " << std::endl;
				std::cout.flush();
			}
		}
#endif
		/**
		 *Lock mutex and search for an available element
		 *A global variable to be updated whenever a element is processed
		 */
		
		//Lock a mutex and get an element number
		int64_t local_element = parfront->fCurrentAssembled;
		parfront->fCurrentAssembled++;
		
		if(parfront->fElementOrder[local_element] < 0) continue;
		TPZCompEl *el = elementvec[parfront->fElementOrder[local_element]];
		if(!el) continue;
		TPZMaterial * mat = el->Material();
		if(mat)
		{
			int matid = mat->Id();
			if(parfront->ShouldCompute(matid) == false)
			{
				continue;
			}
		}
		else 
		{
			TPZSubCompMesh *submesh = dynamic_cast<TPZSubCompMesh *> (el);
            TPZElementGroup *elgrp = dynamic_cast<TPZElementGroup *>(el);
            TPZCondensedCompEl *condel = dynamic_cast<TPZCondensedCompEl *>(el);
			if(!submesh && ! elgrp && ! condel)
			{
				continue;
			}
		}
		
		//Searches for next element
		int64_t i=0;
		int64_t aux = -1;
		TPZElementMatrix *ekaux = 0, *efaux = 0;
        {
            std::unique_lock<std::mutex> global_lock(mutex_global_assemble);
#ifdef PZ_LOG
            if (logger.isDebugEnabled())
            {
                std::stringstream sout;
                sout << "Acquired mutex_global_assemble";
                LOGPZ_DEBUG(logger,sout.str())
            }
#endif
            while(aux != local_element){
                while(i < parfront->felnum.NElements()) {
                    if(parfront->felnum[i] == local_element){
                        TPZElementMatrix *ektemp, *eftemp;
                        aux = parfront->felnum[i];
                        ekaux = parfront->fekstack[i];
                        efaux = parfront->fefstack[i];
                        int64_t itemp = parfront->felnum.Pop();
                        ektemp = parfront->fekstack.Pop();
                        eftemp = parfront->fefstack.Pop();
                        if(parfront->felnum.NElements()<parfront->fMaxStackSize){
                            stackfull.notify_all();
                        }
                        if(i < parfront->felnum.NElements()) {
                            
                            parfront->felnum[i] = itemp;
                            parfront->fekstack[i]=ektemp;
                            parfront->fefstack[i]=eftemp;
                        }
                        break;
                    }
                    i++;
                }
                if(aux!=local_element){
                    i=0;
    #ifdef PZ_LOG
                    if (logger.isDebugEnabled())
                    {
                        std::stringstream sout;
                        sout << "Waiting on condassemble";
                        LOGPZ_DEBUG(logger,sout.str())
                    }
    #endif
                    condassemble.wait(global_lock);
                }
            }
    #ifdef PZ_LOG
            if (logger.isDebugEnabled())
            {
                std::stringstream sout;
                sout << "Unlocking mutex_global_assemble";
                LOGPZ_DEBUG(logger,sout.str())
            }
    #endif
            // global_lock is being destroyed...
        }
		parfront->AssembleElement(el, *ekaux, *efaux, *parfront->fStiffness, *parfront->fRhs);
		if(parfront->fCurrentAssembled == parfront->fNElements)
		{
#ifdef STACKSTORAGE
            TPZParFrontMatrix<TVar,TPZStackEqnStorage<TVar>, TFront> *mat = dynamic_cast< TPZParFrontMatrix<TVar, TPZStackEqnStorage<TVar>, front>* > (parfront->fStiffness);
#else
            TPZParFrontMatrix<TVar, TPZFileEqnStorage<TVar>, TFront> *mat = dynamic_cast<TPZParFrontMatrix<TVar, TPZFileEqnStorage<TVar>, TFront>* > (parfront->fStiffness);
            
#endif
			mat->FinishWriting();
#ifdef PZ_LOG
            if (logger.isDebugEnabled())
			{
				std::stringstream sout;
				sout << "fFinishedComputing set to 1";
				LOGPZ_DEBUG(logger,sout.str())
			}
#endif
		}
		
		delete ekaux;
		delete efaux;
		
		if(parfront->fGuiInterface) if(parfront->fGuiInterface->AmIKilled()){
#ifdef STACKSTORAGE
			TPZParFrontMatrix<TVar, TPZStackEqnStorage<TVar>, front> *mat = dynamic_cast<TPZParFrontMatrix<TVar, TPZStackEqnStorage<TVar>, front>* > (parfront->fStiffness);
#else
            TPZParFrontMatrix<TVar, TPZFileEqnStorage<TVar>, TFront> *mat = dynamic_cast<TPZParFrontMatrix<TVar, TPZFileEqnStorage<TVar>, TFront>* > (parfront->fStiffness);
            
#endif
			mat->FinishWriting();
			break;
		}
		
		
	}//fim for iel
#ifdef PZ_LOG
    if (logger.isDebugEnabled())
	{
		std::stringstream sout;
		sout << "Terminating assemble thread";
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	std::cout << "Matrix assembled\n";
	std::cout.flush();

	return 0;
}